

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QSize __thiscall QGraphicsView::sizeHint(QGraphicsView *this)

{
  bool bVar1;
  QGraphicsViewPrivate *this_00;
  QSize QVar2;
  QSizeF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QSizeF baseSize;
  QSize *in_stack_ffffffffffffff28;
  QSizeF *in_stack_ffffffffffffff30;
  QRectF *this_01;
  QAbstractScrollArea *in_stack_ffffffffffffff58;
  QSizeF local_68 [3];
  undefined1 local_38 [32];
  QSizeF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsView *)0xa37c80);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa37c96);
  if (bVar1) {
    local_18.ht = -NAN;
    local_18.wd = -NAN;
    this_01 = (QRectF *)&this_00->matrix;
    sceneRect((QGraphicsView *)in_RDI);
    QTransform::mapRect((QRectF *)local_38);
    local_18 = QRectF::size(this_01);
    QSizeF::QSizeF(local_68,(double)((int)(this_00->super_QAbstractScrollAreaPrivate).
                                          super_QFramePrivate.frameWidth << 1),
                   (double)((int)(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 frameWidth << 1));
    QSizeF::operator+=(&local_18,local_68);
    QGuiApplication::primaryScreen();
    QScreen::virtualSize();
    ::operator*((qreal)in_stack_ffffffffffffff28,(QSize *)0xa37d7c);
    operator/((QSize *)in_RDI,(qreal)this_01);
    QSizeF::QSizeF(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    QSizeF::boundedTo((QSizeF *)this_00,in_RDI);
    QVar2 = QSizeF::toSize(in_RDI);
  }
  else {
    QVar2 = QAbstractScrollArea::sizeHint(in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QGraphicsView::sizeHint() const
{
    Q_D(const QGraphicsView);
    if (d->scene) {
        QSizeF baseSize = d->matrix.mapRect(sceneRect()).size();
        baseSize += QSizeF(d->frameWidth * 2, d->frameWidth * 2);
        return baseSize.boundedTo((3 * QGuiApplication::primaryScreen()->virtualSize()) / 4).toSize();
    }
    return QAbstractScrollArea::sizeHint();
}